

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O2

size_t Diligent::ComputeHashRaw(void *pData,size_t Size)

{
  char (*in_RCX) [21];
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  size_t Hash;
  string msg;
  size_t local_58;
  string local_50;
  
  local_58 = 0;
  puVar3 = (uint *)(Size + (long)pData);
  puVar4 = (uint *)((long)pData + 3U & 0xfffffffffffffffc);
  uVar1 = 0;
  uVar2 = 0;
  for (; (pData < puVar3 && (pData < puVar4)); pData = (void *)((long)pData + 1)) {
    in_RCX = (char (*) [21])(uVar1 & 0xffffffff);
    uVar2 = uVar2 | (ulong)(byte)*pData << ((byte)in_RCX & 0x3f);
    uVar1 = uVar1 + 8;
  }
  if (0x18 < uVar1) {
    FormatString<char[26],char[12]>
              (&local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Shift <= 24",
               (char (*) [12])in_RCX);
    in_RCX = (char (*) [21])0x9e;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
               "ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0x9e);
    std::__cxx11::string::~string((string *)&local_50);
  }
  while (puVar4 + 1 <= puVar3) {
    in_RCX = (char (*) [21])(uVar1 & 0xffffffff);
    uVar2 = (ulong)*puVar4 << ((byte)in_RCX & 0x3f) | uVar2;
    local_50._M_dataplus._M_p._0_4_ = (undefined4)uVar2;
    HashCombine<unsigned_int>(&local_58,(uint *)&local_50);
    uVar2 = uVar2 >> 0x20;
    puVar4 = puVar4 + 1;
  }
  for (; puVar4 < puVar3; puVar4 = (uint *)((long)puVar4 + 1)) {
    in_RCX = (char (*) [21])(uVar1 & 0xffffffff);
    uVar2 = uVar2 | (ulong)(byte)*puVar4 << ((byte)in_RCX & 0x3f);
    uVar1 = uVar1 + 8;
  }
  if (0x30 < uVar1) {
    FormatString<char[26],char[21]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shift <= (3 + 3) * 8",in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
               "ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xaf);
    std::__cxx11::string::~string((string *)&local_50);
  }
  while (uVar1 != 0) {
    local_50._M_dataplus._M_p._0_4_ = (undefined4)uVar2;
    HashCombine<unsigned_int>(&local_58,(uint *)&local_50);
    uVar2 = uVar2 >> 0x20;
    bVar5 = uVar1 < 0x20;
    uVar1 = uVar1 - 0x20;
    if (bVar5) {
      uVar1 = 0;
    }
  }
  return local_58;
}

Assistant:

inline std::size_t ComputeHashRaw(const void* pData, size_t Size) noexcept
{
    size_t Hash = 0;

    const auto* BytePtr  = static_cast<const Uint8*>(pData);
    const auto* EndPtr   = BytePtr + Size;
    const auto* DwordPtr = static_cast<const Uint32*>(AlignUp(pData, alignof(Uint32)));

    // Process initial bytes before we get to the 32-bit aligned pointer
    Uint64 Buffer = 0;
    Uint64 Shift  = 0;
    while (BytePtr < EndPtr && BytePtr < reinterpret_cast<const Uint8*>(DwordPtr))
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= 24);

    // Process dwords
    while (DwordPtr + 1 <= reinterpret_cast<const Uint32*>(EndPtr))
    {
        Buffer |= Uint64{*(DwordPtr++)} << Shift;
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
    }

    // Process the remaining bytes
    BytePtr = reinterpret_cast<const Uint8*>(DwordPtr);
    while (BytePtr < EndPtr)
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= (3 + 3) * 8);

    while (Shift != 0)
    {
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
        Shift -= (std::min)(Shift, Uint64{32});
    }

    return Hash;
}